

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::add_property
          (rules_holder<cppcms::xss::compare_c_string,_true> *this,string *tname,string *pname,
          validator_type *r)

{
  bool bVar1;
  iterator __k;
  string *other;
  long in_RDI;
  c_string cname;
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
  *in_stack_fffffffffffffee8;
  string *in_stack_ffffffffffffff08;
  mapped_type *in_stack_ffffffffffffff10;
  map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
  *in_stack_ffffffffffffff30;
  _Self local_70 [3];
  _Self local_58 [11];
  
  details::c_string::c_string((c_string *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  __k = std::
        map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
        ::find(in_stack_fffffffffffffee8,(key_type *)0x460f11);
  local_58[0]._M_node = __k._M_node;
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = std::operator==(local_58,local_70);
  if (bVar1) {
    in_stack_ffffffffffffff10 =
         std::
         map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
         ::operator[]((map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
                       *)in_stack_ffffffffffffff30,(key_type *)__k._M_node);
    in_stack_ffffffffffffff10->type = invalid_tag;
  }
  other = (string *)(in_RDI + 0x38);
  details::c_string::c_string((c_string *)in_stack_ffffffffffffff10,other);
  std::
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
  ::operator[]((map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
                *)in_stack_ffffffffffffff30,(key_type *)__k._M_node);
  details::c_string::c_string((c_string *)in_stack_ffffffffffffff10,other);
  std::
  map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
  ::operator[](in_stack_ffffffffffffff30,(key_type *)__k._M_node);
  std::function<bool_(const_char_*,_const_char_*)>::operator=
            ((function<bool_(const_char_*,_const_char_*)> *)in_stack_ffffffffffffff10,
             (function<bool_(const_char_*,_const_char_*)> *)other);
  details::c_string::~c_string((c_string *)0x46102c);
  details::c_string::~c_string((c_string *)0x461036);
  details::c_string::~c_string((c_string *)0x461043);
  return;
}

Assistant:

void add_property(std::string const &tname,std::string const &pname,validator_type const &r)
		{
			c_string cname(tname);
			if(tags.find(cname)==tags.end())
				tags[cname].type=rules::invalid_tag;
			
			tags[c_string(tname)].properties[c_string(pname)]=r;
		}